

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void google::protobuf::CheckFieldIndex(FieldDescriptor *field,int index)

{
  bool bVar1;
  LogMessage *pLVar2;
  string_view v;
  LogMessage local_60;
  Voidify local_49;
  string_view local_48;
  LogMessage local_28;
  Voidify local_15;
  int local_14;
  FieldDescriptor *pFStack_10;
  int index_local;
  FieldDescriptor *field_local;
  
  if (field != (FieldDescriptor *)0x0) {
    local_14 = index;
    pFStack_10 = field;
    bVar1 = FieldDescriptor::is_repeated(field);
    if ((bVar1) && (local_14 == -1)) {
      absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
                ((LogMessageDebugFatal *)&local_28,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
                 ,0xc4);
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_28);
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar2,(char (*) [50])"Index must be in range of repeated field values. ")
      ;
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar2,(char (*) [8])"Field: ");
      local_48 = FieldDescriptor::name(pFStack_10);
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,local_48);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_15,pLVar2);
      absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
                ((LogMessageDebugFatal *)&local_28);
    }
    else {
      bVar1 = FieldDescriptor::is_repeated(pFStack_10);
      if ((!bVar1) && (local_14 != -1)) {
        absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
                  ((LogMessageDebugFatal *)&local_60,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
                   ,199);
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_60);
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                           (pLVar2,(char (*) [38])"Index must be -1 for singular fields.");
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                           (pLVar2,(char (*) [8])"Field: ");
        v = FieldDescriptor::name(pFStack_10);
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,v);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_49,pLVar2);
        absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
                  ((LogMessageDebugFatal *)&local_60);
      }
    }
  }
  return;
}

Assistant:

void CheckFieldIndex(const FieldDescriptor* field, int index) {
  if (field == nullptr) {
    return;
  }

  if (field->is_repeated() && index == -1) {
    ABSL_DLOG(FATAL) << "Index must be in range of repeated field values. "
                     << "Field: " << field->name();
  } else if (!field->is_repeated() && index != -1) {
    ABSL_DLOG(FATAL) << "Index must be -1 for singular fields."
                     << "Field: " << field->name();
  }
}